

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,StringTree *params,
          StringTree *params_1,ArrayPtr<const_char> *params_2,ArrayPtr<const_char> *params_3,
          ArrayPtr<const_char> *params_4,ArrayPtr<const_char> *params_5,
          ArrayPtr<const_char> *params_6,ArrayPtr<const_char> *params_7,
          ArrayPtr<const_char> *params_8,StringTree *params_9,ArrayPtr<const_char> *params_10,
          StringTree *params_11,ArrayPtr<const_char> *params_12)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  char *pcVar3;
  size_t result;
  size_t sVar4;
  long lVar5;
  String local_c8;
  size_t local_a8 [2];
  char *local_98;
  size_t sStack_90;
  size_t local_88;
  size_t sStack_80;
  size_t local_78;
  size_t sStack_70;
  size_t local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  ArrayPtr<const_char> *local_40;
  ArrayPtr<const_char> *local_38;
  
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  local_a8[0] = this->size_;
  local_a8[1] = params->size_;
  local_98 = (params_1->text).content.ptr;
  sStack_90 = params_2->size_;
  local_88 = params_3->size_;
  sStack_80 = params_4->size_;
  local_78 = params_5->size_;
  sStack_70 = params_6->size_;
  local_68 = params_7->size_;
  local_60 = params_8->ptr;
  local_58 = (params_9->text).content.ptr;
  local_50 = params_10->ptr;
  local_48 = (params_11->text).content.ptr;
  sVar4 = 0;
  lVar5 = 0;
  do {
    sVar4 = sVar4 + *(long *)((long)local_a8 + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x68);
  __return_storage_ptr__->size_ = sVar4;
  local_a8[0] = 0;
  local_a8[1] = 0;
  sVar4 = 0;
  local_60 = (char *)0x0;
  local_50 = (char *)0x0;
  lVar5 = 0;
  do {
    sVar4 = sVar4 + *(long *)((long)local_a8 + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x68);
  local_40 = params_3;
  local_38 = params_2;
  heapString(&local_c8,sVar4);
  pcVar3 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar3 != (char *)0x0) {
    sVar4 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar1 = (__return_storage_ptr__->text).content.disposer;
    (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar3,1,sVar4,sVar4,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_c8.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_c8.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_c8.content.disposer;
  local_a8[0] = 1;
  local_a8[1] = 1;
  local_98 = (char *)0x0;
  sStack_90 = 0;
  local_88 = 0;
  sStack_80 = 0;
  local_78 = 0;
  sStack_70 = 0;
  sVar4 = 0;
  local_68 = 0;
  local_60 = (char *)0x1;
  local_58 = (char *)0x0;
  local_50 = (char *)0x1;
  local_48 = (char *)0x0;
  lVar5 = 0;
  do {
    sVar4 = sVar4 + *(long *)((long)local_a8 + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x68);
  local_c8.content.ptr =
       (char *)_::HeapArrayDisposer::allocateImpl
                         (0x40,sVar4,sVar4,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          construct,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          destruct);
  local_c8.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_c8.content.size_ = sVar4;
  if (pBVar2 != (Branch *)0x0) {
    sVar4 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar1 = (__return_storage_ptr__->branches).disposer;
    (**pAVar1->_vptr_ArrayDisposer)
              (pAVar1,pBVar2,0x40,sVar4,sVar4,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = (Branch *)local_c8.content.ptr;
  (__return_storage_ptr__->branches).size_ = local_c8.content.size_;
  (__return_storage_ptr__->branches).disposer = local_c8.content.disposer;
  pcVar3 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar3 != (char *)0x0) {
    pcVar3 = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pcVar3,0,this,params,(ArrayPtr<const_char> *)params_1,local_38,
             local_40,params_4,params_5,params_6,params_7,(StringTree *)params_8,
             (ArrayPtr<const_char> *)params_9,(StringTree *)params_10,
             (ArrayPtr<const_char> *)params_11);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}